

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O1

void __thiscall
ZipArchive::addFile(ZipArchive *this,string *fileName,bool store,uint64_t compSize,
                   uint64_t uncompSize,time_t ts,uint32_t crc,uint16_t flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ZipEntry local_a0;
  ZipArchive *local_40;
  time_t local_38;
  
  paVar1 = &local_a0.name.field_2;
  local_a0.name._M_string_length = 0;
  local_a0.name.field_2._M_local_buf[0] = '\0';
  local_a0.data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  local_a0.name._M_dataplus._M_p = (pointer)paVar1;
  local_40 = this;
  local_38 = ts;
  std::__cxx11::string::_M_assign((string *)&local_a0);
  local_a0.timeStamp = local_38;
  local_a0.crc = crc;
  local_a0.flags = flags;
  local_a0.uid = 0;
  local_a0.gid = 0;
  local_a0.store = store;
  local_a0.dataSize = compSize;
  local_a0.originalSize = uncompSize;
  add(local_40,&local_a0);
  if ((_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
      local_a0.data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
      ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    operator_delete__((void *)local_a0.data._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  local_a0.data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.name._M_dataplus._M_p,
                    CONCAT71(local_a0.name.field_2._M_allocated_capacity._1_7_,
                             local_a0.name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ZipArchive::addFile(const std::string& fileName, bool store,
                         uint64_t compSize, uint64_t uncompSize, time_t ts,
                         uint32_t crc, uint16_t flags)
{
    ZipEntry ze;
    ze.data = nullptr;
    ze.name = fileName;
    ze.store = store;
    ze.dataSize = compSize;
    ze.originalSize = uncompSize;
    ze.timeStamp = ts;
    ze.crc = crc;
    ze.flags = flags;
    ze.gid = 0;
    ze.uid = 0;
    add(ze);
}